

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

void Aig_Support_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vSupp)

{
  uint uVar1;
  void **ppvVar2;
  uint uVar3;
  int iVar4;
  
  while( true ) {
    if (pObj->TravId == p->nTravIds) {
      return;
    }
    pObj->TravId = p->nTravIds;
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar3 = uVar1 & 7;
    if (uVar3 == 1) {
      return;
    }
    if (uVar3 == 2) break;
    if ((uVar3 != 4) && (1 < (uVar1 & 7) - 5)) {
      __assert_fail("Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDfs.c"
                    ,0x33d,"void Aig_Support_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    Aig_Support_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vSupp);
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
    if (pObj == (Aig_Obj_t *)0x0) {
      return;
    }
  }
  uVar1 = vSupp->nCap;
  if (vSupp->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vSupp->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vSupp->pArray,0x80);
      }
      vSupp->pArray = ppvVar2;
      iVar4 = 0x10;
    }
    else {
      iVar4 = uVar1 * 2;
      if (iVar4 <= (int)uVar1) goto LAB_006b056c;
      if (vSupp->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vSupp->pArray,(ulong)uVar1 << 4);
      }
      vSupp->pArray = ppvVar2;
    }
    vSupp->nCap = iVar4;
  }
LAB_006b056c:
  iVar4 = vSupp->nSize;
  vSupp->nSize = iVar4 + 1;
  vSupp->pArray[iVar4] = pObj;
  return;
}

Assistant:

void Aig_Support_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vSupp )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vSupp, pObj );
        return;
    }
    assert( Aig_ObjIsNode(pObj) || Aig_ObjIsBuf(pObj) );
    Aig_Support_rec( p, Aig_ObjFanin0(pObj), vSupp );
    if ( Aig_ObjFanin1(pObj) )
        Aig_Support_rec( p, Aig_ObjFanin1(pObj), vSupp );
}